

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grib2dec.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  int iVar4;
  long *plVar5;
  Output *pOVar6;
  Parameters params;
  G2DEC_Message message;
  Parameters local_128;
  undefined1 local_a8 [48];
  int local_78;
  int local_74;
  int local_38;
  
  local_128.inputFile._M_dataplus._M_p = (pointer)&local_128.inputFile.field_2;
  local_128.inputFile._M_string_length = 0;
  local_128.inputFile.field_2._M_local_buf[0] = '\0';
  paVar1 = &local_128.outputFile.field_2;
  local_128.outputFile._M_string_length = 0;
  local_128.outputFile.field_2._M_local_buf[0] = '\0';
  paVar2 = &local_128.outputFormat.field_2;
  local_128.outputFormat._M_string_length = 0;
  local_128.outputFormat.field_2._M_local_buf[0] = '\0';
  local_128.outputFile._M_dataplus._M_p = (pointer)paVar1;
  local_128.outputFormat._M_dataplus._M_p = (pointer)paVar2;
  if (argc < 2) {
    iVar4 = -1;
    usage();
  }
  else {
    bVar3 = parseArguments(argc,argv,&local_128);
    iVar4 = -1;
    if (bVar3) {
      plVar5 = (long *)grib2dec::Grib2Dec::create(local_128.inputFile._M_dataplus._M_p);
      if (plVar5 != (long *)0x0) {
        (**(code **)(*plVar5 + 8))(plVar5,&local_128.filter);
        pOVar6 = grib2dec_demo::Output::create(&local_128.outputFile,&local_128.outputFormat);
        do {
          while( true ) {
            iVar4 = (**(code **)*plVar5)(plVar5,local_a8);
            if (iVar4 != 0) break;
            if (local_38 != local_74 * local_78) {
              __assert_fail("message.valuesLength == message.grid.ni * message.grid.nj",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/LouJo[P]grib2dec/apps/grib2dec.cpp"
                            ,0x6b,"int main(int, char **)");
            }
            (**pOVar6->_vptr_Output)(pOVar6,local_a8);
          }
        } while (iVar4 != 1);
        (*pOVar6->_vptr_Output[1])(pOVar6);
        (*pOVar6->_vptr_Output[3])(pOVar6);
        (**(code **)(*plVar5 + 0x18))(plVar5);
        iVar4 = 0;
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128.outputFormat._M_dataplus._M_p != paVar2) {
    operator_delete(local_128.outputFormat._M_dataplus._M_p,
                    CONCAT71(local_128.outputFormat.field_2._M_allocated_capacity._1_7_,
                             local_128.outputFormat.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128.outputFile._M_dataplus._M_p != paVar1) {
    operator_delete(local_128.outputFile._M_dataplus._M_p,
                    CONCAT71(local_128.outputFile.field_2._M_allocated_capacity._1_7_,
                             local_128.outputFile.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128.inputFile._M_dataplus._M_p != &local_128.inputFile.field_2) {
    operator_delete(local_128.inputFile._M_dataplus._M_p,
                    CONCAT71(local_128.inputFile.field_2._M_allocated_capacity._1_7_,
                             local_128.inputFile.field_2._M_local_buf[0]) + 1);
  }
  return iVar4;
}

Assistant:

int main(int argc, char *argv[])
{
    Parameters params;

    if (argc < 2)
        return usage(), -1;

    if (!parseArguments(argc, argv, params))
        return -1;

    grib2dec::Grib2Dec *decoder =
            grib2dec::Grib2Dec::create(params.inputFile.c_str());

    if (!decoder)
        return -1;

    decoder->setSpatialFilter(params.filter);

    Output *output = Output::create(params.outputFile, params.outputFormat);

    int nbMessages = 0;

    while (true) {
        G2DEC_Message message;
        auto status = decoder->nextMessage(message);
        if (status == G2DEC_STATUS_END)
            break;
        else if (status == G2DEC_STATUS_OK) {
            assert(message.valuesLength == message.grid.ni * message.grid.nj);
            output->setComponent(message);
            nbMessages++;
        }
    }

    output->end();

    delete output;
    delete decoder;

    return 0;
}